

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_thread.cpp
# Opt level: O3

void __thiscall zmq::io_thread_t::in_event(io_thread_t *this)

{
  uint uVar1;
  ssize_t sVar2;
  uint *puVar3;
  size_t in_RCX;
  int in_R8D;
  command_t cmd;
  command_t local_c0 [2];
  
  do {
    while( true ) {
      sVar2 = mailbox_t::recv(&this->_mailbox,(int)local_c0,(void *)0x0,in_RCX,in_R8D);
      if ((int)sVar2 != 0) break;
      object_t::process_command(local_c0[0].destination,local_c0);
    }
    puVar3 = (uint *)__errno_location();
    uVar1 = *puVar3;
  } while (uVar1 == 4);
  if (uVar1 != 0xb) {
    in_event((io_thread_t *)(ulong)uVar1);
  }
  return;
}

Assistant:

void zmq::io_thread_t::in_event ()
{
    //  TODO: Do we want to limit number of commands I/O thread can
    //  process in a single go?

    command_t cmd;
    int rc = _mailbox.recv (&cmd, 0);

    while (rc == 0 || errno == EINTR) {
        if (rc == 0)
            cmd.destination->process_command (cmd);
        rc = _mailbox.recv (&cmd, 0);
    }

    errno_assert (rc != 0 && errno == EAGAIN);
}